

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClearIniSettings(void)

{
  char *ptr;
  ImGuiContext *pIVar1;
  long lVar2;
  ImGuiSettingsHandler *handler;
  ImGuiSettingsHandler *pIVar3;
  
  pIVar1 = GImGui;
  ptr = (GImGui->SettingsIniData).Buf.Data;
  if (ptr != (char *)0x0) {
    (pIVar1->SettingsIniData).Buf.Size = 0;
    (pIVar1->SettingsIniData).Buf.Capacity = 0;
    MemFree(ptr);
    (pIVar1->SettingsIniData).Buf.Data = (char *)0x0;
  }
  lVar2 = (long)(pIVar1->SettingsHandlers).Size;
  if (lVar2 != 0) {
    pIVar3 = (pIVar1->SettingsHandlers).Data;
    lVar2 = lVar2 * 0x48;
    do {
      if (pIVar3->ClearAllFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
        (*pIVar3->ClearAllFn)(pIVar1,pIVar3);
      }
      pIVar3 = pIVar3 + 1;
      lVar2 = lVar2 + -0x48;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void ImGui::ClearIniSettings()
{
    ImGuiContext& g = *GImGui;
    g.SettingsIniData.clear();
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        if (handler.ClearAllFn != NULL)
            handler.ClearAllFn(&g, &handler);
}